

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompression.cpp
# Opt level: O0

void Imf_3_4::getCompressionNamesString(string *separator,string *str)

{
  string *in_RSI;
  int i;
  string local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  int local_14;
  
  for (local_14 = 0; local_14 < 9; local_14 = local_14 + 1) {
    std::operator+(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    std::__cxx11::string::operator+=(in_RSI,local_38);
    std::__cxx11::string::~string(local_38);
  }
  std::__cxx11::string::operator+=(in_RSI,(string *)(IdToDesc + (long)local_14 * 0x48));
  return;
}

Assistant:

void
getCompressionNamesString (const std::string& separator, std::string& str)
{
    int i = 0;
    for (; i < static_cast<int> (NUM_COMPRESSION_METHODS) - 1; i++)
    {
        str += IdToDesc[i].name + separator;
    }
    str += IdToDesc[i].name;
}